

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosLog.h
# Opt level: O0

void adios2::helper::Throw<std::logic_error>
               (string *component,string *source,string *activity,string *message,int commRank)

{
  logic_error *this;
  string m;
  int in_stack_0000024c;
  string *in_stack_00000250;
  string *in_stack_00000258;
  string *in_stack_00000260;
  string *in_stack_00000268;
  LogMode in_stack_00000280;
  string local_48 [72];
  
  MakeMessage(in_stack_00000268,in_stack_00000260,in_stack_00000258,in_stack_00000250,
              in_stack_0000024c,in_stack_00000280);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,local_48);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Throw(const std::string &component, const std::string &source, const std::string &activity,
           const std::string &message, const int commRank = -1)
{
    auto m = MakeMessage(component, source, activity, message, commRank, LogMode::EXCEPTION);
    throw(T(m));
}